

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O1

void Llb_ManLabelLiCones_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = *(ulong *)&pObj->field_0x18;
    if ((uVar1 & 0x20) != 0) {
      return;
    }
    *(ulong *)&pObj->field_0x18 = uVar1 | 0x20;
    if (((uint)uVar1 & 7) - 7 < 0xfffffffe) break;
    Llb_ManLabelLiCones_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Pivot.c"
                ,0x87,"void Llb_ManLabelLiCones_rec(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Llb_ManLabelLiCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManLabelLiCones_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManLabelLiCones_rec( p, Aig_ObjFanin1(pObj) );
}